

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O3

void __thiscall FConsoleBuffer::FreeBrokenText(FConsoleBuffer *this,uint start,uint end)

{
  uint uVar1;
  FBrokenLines **ppFVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = (this->mBrokenConsoleText).Count;
  if (uVar1 < end) {
    end = uVar1;
  }
  iVar3 = end - start;
  if (start <= end && iVar3 != 0) {
    uVar4 = (ulong)start;
    do {
      ppFVar2 = (this->mBrokenConsoleText).Array;
      if (ppFVar2[uVar4] != (FBrokenLines *)0x0) {
        V_FreeBrokenLines(ppFVar2[uVar4]);
        ppFVar2 = (this->mBrokenConsoleText).Array;
      }
      ppFVar2[uVar4] = (FBrokenLines *)0x0;
      uVar4 = uVar4 + 1;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void FConsoleBuffer::FreeBrokenText(unsigned start, unsigned end)
{
	if (end > mBrokenConsoleText.Size()) end = mBrokenConsoleText.Size();
	for (unsigned i = start; i < end; i++)
	{
		if (mBrokenConsoleText[i] != NULL) V_FreeBrokenLines(mBrokenConsoleText[i]);
		mBrokenConsoleText[i] = NULL;
	}
}